

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.h
# Opt level: O0

void __thiscall
Sphere::Sphere(Sphere *this,Vec3 *center,float radius,Material *material,bool animated,
              float animation_start,float animation_end)

{
  byte in_CL;
  _func_int **in_RDX;
  Object *in_RDI;
  undefined4 in_XMM0_Da;
  float fVar1;
  double dVar2;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  Vec3 *in_stack_ffffffffffffff78;
  Vec3 *in_stack_ffffffffffffff80;
  Vec3 *v2;
  undefined4 in_stack_ffffffffffffff88;
  Vec3 local_54;
  Vec3 local_48 [2];
  undefined4 local_2c;
  undefined4 local_28;
  byte local_21;
  _func_int **local_20;
  undefined4 local_14;
  
  local_21 = in_CL & 1;
  local_2c = in_XMM2_Da;
  local_28 = in_XMM1_Da;
  local_20 = in_RDX;
  local_14 = in_XMM0_Da;
  Object::Object(in_RDI);
  in_RDI->_vptr_Object = (_func_int **)&PTR__Sphere_0012eb68;
  Vec3::Vec3(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  Vec3::Vec3((Vec3 *)((long)&in_RDI[2]._vptr_Object + 4));
  *(undefined4 *)&in_RDI[4]._vptr_Object = local_14;
  in_RDI[5]._vptr_Object = local_20;
  *(byte *)&in_RDI[6]._vptr_Object = local_21 & 1;
  *(undefined4 *)((long)&in_RDI[6]._vptr_Object + 4) = local_28;
  *(undefined4 *)&in_RDI[7]._vptr_Object = local_2c;
  v2 = (Vec3 *)(in_RDI + 1);
  fVar1 = *(float *)&in_RDI[4]._vptr_Object + *(float *)&in_RDI[4]._vptr_Object;
  dVar2 = drand48();
  Vec3::Vec3(&local_54,0.0,fVar1 * (float)dVar2,0.0);
  operator+((Vec3 *)CONCAT44(fVar1,in_stack_ffffffffffffff88),v2);
  *(undefined8 *)((long)&in_RDI[2]._vptr_Object + 4) = local_48[0].e._0_8_;
  *(float *)((long)&in_RDI[3]._vptr_Object + 4) = local_48[0].e[2];
  Vec3::~Vec3(local_48);
  Vec3::~Vec3(&local_54);
  return;
}

Assistant:

explicit Sphere(const Vec3& center, float radius, Material *material, bool animated=false, float animation_start=0.0f, float animation_end=1.0f) :
     m_center(center), m_radius(radius), m_material(material), m_animated(animated), m_animation_start(animation_start), m_animation_end(animation_end)
     { m_center_end = m_center + Vec3(0.0f, 2.0f*m_radius*RANDOM_GEN(), 0.0f); }